

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_unittest.cc
# Opt level: O2

void Test_Demangle_Clones::RunTest(void)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char tmp [20];
  
  bVar1 = google::Demangle("_ZL3Foov",tmp,0x14);
  if (bVar1) {
    iVar2 = bcmp("Foo()",tmp,6);
    if (iVar2 != 0) {
LAB_00109bbb:
      fprintf(_stderr,"Check failed: streq(%s, %s)\n","\"Foo()\"","tmp");
      goto LAB_00109ce1;
    }
    bVar1 = google::Demangle("_ZL3Foov.clone.3",tmp,0x14);
    if (bVar1) {
      iVar2 = bcmp("Foo()",tmp,6);
      if (iVar2 != 0) goto LAB_00109bbb;
      bVar1 = google::Demangle("_ZL3Foov.constprop.80",tmp,0x14);
      if (bVar1) {
        iVar2 = bcmp("Foo()",tmp,6);
        if (iVar2 != 0) goto LAB_00109bbb;
        bVar1 = google::Demangle("_ZL3Foov.isra.18",tmp,0x14);
        if (bVar1) {
          iVar2 = bcmp("Foo()",tmp,6);
          if (iVar2 != 0) goto LAB_00109bbb;
          bVar1 = google::Demangle("_ZL3Foov.isra.2.constprop.18",tmp,0x14);
          if (bVar1) {
            iVar2 = bcmp("Foo()",tmp,6);
            if (iVar2 != 0) goto LAB_00109bbb;
            bVar1 = google::Demangle("_ZL3Foov.clo",tmp,0x14);
            if (bVar1) {
              pcVar3 = "!(Demangle(\"_ZL3Foov.clo\", tmp, sizeof(tmp)))";
            }
            else {
              bVar1 = google::Demangle("_ZL3Foov.clone.",tmp,0x14);
              if (bVar1) {
                pcVar3 = "!(Demangle(\"_ZL3Foov.clone.\", tmp, sizeof(tmp)))";
              }
              else {
                bVar1 = google::Demangle("_ZL3Foov.clone.foo",tmp,0x14);
                if (bVar1) {
                  pcVar3 = "!(Demangle(\"_ZL3Foov.clone.foo\", tmp, sizeof(tmp)))";
                }
                else {
                  bVar1 = google::Demangle("_ZL3Foov.isra.2.constprop.",tmp,0x14);
                  if (!bVar1) {
                    return;
                  }
                  pcVar3 = "!(Demangle(\"_ZL3Foov.isra.2.constprop.\", tmp, sizeof(tmp)))";
                }
              }
            }
          }
          else {
            pcVar3 = "Demangle(\"_ZL3Foov.isra.2.constprop.18\", tmp, sizeof(tmp))";
          }
        }
        else {
          pcVar3 = "Demangle(\"_ZL3Foov.isra.18\", tmp, sizeof(tmp))";
        }
      }
      else {
        pcVar3 = "Demangle(\"_ZL3Foov.constprop.80\", tmp, sizeof(tmp))";
      }
    }
    else {
      pcVar3 = "Demangle(\"_ZL3Foov.clone.3\", tmp, sizeof(tmp))";
    }
  }
  else {
    pcVar3 = "Demangle(\"_ZL3Foov\", tmp, sizeof(tmp))";
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar3);
LAB_00109ce1:
  exit(1);
}

Assistant:

TEST(Demangle, Clones) {
  char tmp[20];
  EXPECT_TRUE(Demangle("_ZL3Foov", tmp, sizeof(tmp)));
  EXPECT_STREQ("Foo()", tmp);
  EXPECT_TRUE(Demangle("_ZL3Foov.clone.3", tmp, sizeof(tmp)));
  EXPECT_STREQ("Foo()", tmp);
  EXPECT_TRUE(Demangle("_ZL3Foov.constprop.80", tmp, sizeof(tmp)));
  EXPECT_STREQ("Foo()", tmp);
  EXPECT_TRUE(Demangle("_ZL3Foov.isra.18", tmp, sizeof(tmp)));
  EXPECT_STREQ("Foo()", tmp);
  EXPECT_TRUE(Demangle("_ZL3Foov.isra.2.constprop.18", tmp, sizeof(tmp)));
  EXPECT_STREQ("Foo()", tmp);
  // Invalid (truncated), should not demangle.
  EXPECT_FALSE(Demangle("_ZL3Foov.clo", tmp, sizeof(tmp)));
  // Invalid (.clone. not followed by number), should not demangle.
  EXPECT_FALSE(Demangle("_ZL3Foov.clone.", tmp, sizeof(tmp)));
  // Invalid (.clone. followed by non-number), should not demangle.
  EXPECT_FALSE(Demangle("_ZL3Foov.clone.foo", tmp, sizeof(tmp)));
  // Invalid (.constprop. not followed by number), should not demangle.
  EXPECT_FALSE(Demangle("_ZL3Foov.isra.2.constprop.", tmp, sizeof(tmp)));
}